

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O0

void __thiscall leveldb::Table::ReadFilter(Table *this,Slice *filter_handle_value)

{
  bool bVar1;
  char *pcVar2;
  FilterBlockReader *this_00;
  Status local_70;
  undefined1 local_68 [8];
  BlockContents block;
  ReadOptions opt;
  undefined1 local_38 [8];
  BlockHandle filter_handle;
  Slice v;
  Slice *filter_handle_value_local;
  Table *this_local;
  
  filter_handle.size_ = (uint64_t)filter_handle_value->data_;
  BlockHandle::BlockHandle((BlockHandle *)local_38);
  BlockHandle::DecodeFrom((BlockHandle *)&opt.snapshot,(Slice *)local_38);
  bVar1 = Status::ok((Status *)&opt.snapshot);
  Status::~Status((Status *)&opt.snapshot);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    ReadOptions::ReadOptions((ReadOptions *)&block.cachable);
    if (((this->rep_->options).paranoid_checks & 1U) != 0) {
      block.cachable = true;
    }
    BlockContents::BlockContents((BlockContents *)local_68);
    ReadBlock((leveldb *)&local_70,this->rep_->file,(ReadOptions *)&block.cachable,
              (BlockHandle *)local_38,(BlockContents *)local_68);
    bVar1 = Status::ok(&local_70);
    Status::~Status(&local_70);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if ((block.data.size_._1_1_ & 1) != 0) {
        pcVar2 = Slice::data((Slice *)local_68);
        this->rep_->filter_data = pcVar2;
      }
      this_00 = (FilterBlockReader *)operator_new(0x28);
      FilterBlockReader::FilterBlockReader
                (this_00,(this->rep_->options).filter_policy,(Slice *)local_68);
      this->rep_->filter = this_00;
    }
  }
  return;
}

Assistant:

void Table::ReadFilter(const Slice& filter_handle_value) {
  Slice v = filter_handle_value;
  BlockHandle filter_handle;
  if (!filter_handle.DecodeFrom(&v).ok()) {
    return;
  }

  // We might want to unify with ReadBlock() if we start
  // requiring checksum verification in Table::Open.
  ReadOptions opt;
  if (rep_->options.paranoid_checks) {
    opt.verify_checksums = true;
  }
  BlockContents block;
  if (!ReadBlock(rep_->file, opt, filter_handle, &block).ok()) {
    return;
  }
  if (block.heap_allocated) {
    rep_->filter_data = block.data.data();  // Will need to delete later
  }
  rep_->filter = new FilterBlockReader(rep_->options.filter_policy, block.data);
}